

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  Message *pMVar1;
  int in_ECX;
  size_t extraout_RDX;
  String SVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_48;
  char *local_40;
  char *local_38;
  string local_30;
  
  Message::Message((Message *)&sStack_48);
  internal::FormatFileLocation_abi_cxx11_
            (&local_30,(internal *)(test_part_result->file_name_).c_str_,
             (char *)(ulong)(uint)test_part_result->line_number_,in_ECX);
  pMVar1 = Message::operator<<((Message *)&sStack_48,&local_30);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x1385f5);
  if ((ulong)test_part_result->type_ < 3) {
    local_38 = &DAT_00137490 + *(int *)(&DAT_00137490 + (ulong)test_part_result->type_ * 4);
  }
  else {
    local_38 = "Unknown result type";
  }
  pMVar1 = Message::operator<<(pMVar1,&local_38);
  local_40 = (test_part_result->message_).c_str_;
  Message::operator<<(pMVar1,&local_40);
  Message::GetString((Message *)this);
  std::__cxx11::string::~string((string *)&local_30);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_48);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}